

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macros.cc
# Opt level: O3

bool __thiscall pstack::Dwarf::Macros::visit4(Macros *this,Unit *u,MacroVisitor *visitor)

{
  Reader *this_00;
  LineInfo *pLVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  unique_ptr<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_> *puVar5;
  undefined4 extraout_var;
  long lVar6;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  bool bVar7;
  Off offset;
  long lVar8;
  uchar local_60;
  undefined7 uStack_5f;
  uchar q;
  long local_50 [2];
  MacroVisitor *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  local_40 = visitor;
  puVar5 = Unit::getLines(u);
  this_00 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38 = (this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_38->_M_use_count = local_38->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_38->_M_use_count = local_38->_M_use_count + 1;
    }
  }
  (*this_00->_vptr_Reader[8])(this_00);
  offset = 0;
switchD_00141fb0_default:
  Reader::readObj<unsigned_char>(this_00,offset,&local_60,1);
  offset = offset + 1;
  switch(local_60) {
  case '\0':
    goto switchD_00141fb0_caseD_0;
  case '\x01':
    iVar3 = (*this_00->_vptr_Reader[3])(this_00,offset);
    lVar6 = extraout_RDX + offset;
    (*this_00->_vptr_Reader[7])(&local_60,this_00,lVar6);
    lVar8 = _q;
    (*(code *)**(undefined8 **)local_40)(local_40,iVar3,&local_60);
    break;
  case '\x02':
    iVar3 = (*this_00->_vptr_Reader[3])(this_00,offset);
    lVar6 = extraout_RDX_02 + offset;
    (*this_00->_vptr_Reader[7])(&local_60,this_00,lVar6);
    lVar8 = _q;
    (**(code **)(*(long *)local_40 + 8))(local_40,iVar3,&local_60);
    break;
  case '\x03':
    iVar3 = (*this_00->_vptr_Reader[3])(this_00,offset);
    iVar4 = (*this_00->_vptr_Reader[3])(this_00,extraout_RDX_00 + offset);
    pLVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>
             ._M_t.
             super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>
             .super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl;
    lVar8 = *(long *)&(pLVar1->files).
                      super__Vector_base<pstack::Dwarf::FileEntry,_std::allocator<pstack::Dwarf::FileEntry>_>
                      ._M_impl;
    lVar6 = CONCAT44(extraout_var,iVar4) * 0x30;
    cVar2 = (**(code **)(*(long *)local_40 + 0x10))
                      (local_40,iVar3,
                       (ulong)*(uint *)(lVar8 + 0x20 + lVar6) * 0x20 +
                       *(long *)&(pLVar1->directories).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl,lVar8 + lVar6);
    offset = extraout_RDX_01 + extraout_RDX_00 + offset;
    goto joined_r0x00142067;
  case '\x04':
    cVar2 = (**(code **)(*(long *)local_40 + 0x18))();
joined_r0x00142067:
    if (cVar2 == '\0') {
      bVar7 = false;
      goto LAB_001420d7;
    }
  default:
    goto switchD_00141fb0_default;
  }
  if ((long *)CONCAT71(uStack_5f,local_60) != local_50) {
    operator_delete((long *)CONCAT71(uStack_5f,local_60),local_50[0] + 1);
  }
  offset = lVar8 + lVar6 + 1;
  goto switchD_00141fb0_default;
switchD_00141fb0_caseD_0:
  bVar7 = true;
LAB_001420d7:
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return bVar7;
}

Assistant:

bool
Macros::visit4(Unit &u, MacroVisitor *visitor) const
{
    const auto &lineinfo = u.getLines();
    DWARFReader dr(io);
    for (bool done = false; !done; ) {
        auto code = DWARF_MACINFO_CODE(dr.getu8());
        switch (code) {
            case DW_MACINFO_define: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->define(line, text);
                break;
            }
            case DW_MACINFO_eol: {
                done = true;
                break;
            }
            case DW_MACINFO_undef: {
                auto line = dr.getuleb128();
                auto text = dr.getstring();
                visitor->undef(line, text);
                break;
            }
            case DW_MACINFO_start_file: {
                auto line = dr.getuleb128();
                auto file = dr.getuleb128();
                auto &fileinfo = lineinfo->files[file];
                if (!visitor->startFile(line, lineinfo->directories[fileinfo.dirindex], fileinfo))
                    return false;
                break;
            }
            case DW_MACINFO_end_file: {
                if (!visitor->endFile())
                    return 0;
                break;
            }
            case DW_MACINFO_vendor_ext:
                break;
        }
    }
    return true;
}